

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-error.c
# Opt level: O1

char * bson_strerror_r(int err_code,char *buf,size_t buflen)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_0000003c;
  
  iVar1 = __xpg_strerror_r(CONCAT44(in_register_0000003c,err_code));
  pcVar2 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar2 = buf;
  }
  if (pcVar2 == (char *)0x0) {
    bson_strncpy(buf,"Unknown error",buflen);
    pcVar2 = buf;
  }
  return pcVar2;
}

Assistant:

char *
bson_strerror_r (int err_code,  /* IN */
                 char *buf,     /* IN */
                 size_t buflen) /* IN */
{
   static const char *unknown_msg = "Unknown error";
   char *ret = NULL;

#if defined(_WIN32)
   if (strerror_s (buf, buflen, err_code) != 0) {
      ret = buf;
   }
#elif defined(__GNUC__) && defined(_GNU_SOURCE)
   ret = strerror_r (err_code, buf, buflen);
#else /* XSI strerror_r */
   if (strerror_r (err_code, buf, buflen) == 0) {
      ret = buf;
   }
#endif

   if (!ret) {
      bson_strncpy (buf, unknown_msg, buflen);
      ret = buf;
   }

   return ret;
}